

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

bool __thiscall QWidget::focusNextPrevChild(QWidget *this,bool next)

{
  uint uVar1;
  char cVar2;
  undefined1 uVar3;
  code *UNRECOVERED_JUMPTABLE;
  QWidget *this_00;
  long lVar4;
  long *plVar5;
  QWindow *pQVar6;
  long in_FS_OFFSET;
  bool wrappingOccurred;
  bool local_49;
  undefined1 *local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  if ((((uVar1 & 1) == 0) &&
      (plVar5 = *(long **)(*(long *)&this->field_0x8 + 0x10), plVar5 != (long *)0x0)) &&
     ((uVar1 & 0xfe) != 0x12)) {
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar5 + 0x198);
  }
  else {
    lVar4 = *(long *)(*(long *)&this->field_0x8 + 0x78);
    if ((lVar4 == 0) || (plVar5 = *(long **)(lVar4 + 0x10), plVar5 == (long *)0x0)) {
      local_49 = false;
      this_00 = QApplicationPrivate::focusNextPrevChild_helper(this,next,&local_49);
      if (this_00 != (QWidget *)0x0) {
        if (local_49 == true) {
          lVar4 = *(long *)(*(long *)&this->field_0x8 + 0x78);
          if (lVar4 == 0) {
            lVar4 = 0;
          }
          else {
            lVar4 = *(long *)(lVar4 + 8);
          }
          if (lVar4 == 0) {
            pQVar6 = (QWindow *)0x0;
          }
          else {
            pQVar6 = *(QWindow **)(lVar4 + 0x20);
          }
          if (pQVar6 != (QWindow *)0x0) {
            lVar4 = qt_window_private(pQVar6);
            if (*(long *)(lVar4 + 0x88) != 0) {
              local_38 = &DAT_aaaaaaaaaaaaaaaa;
              local_48 = &DAT_aaaaaaaaaaaaaaaa;
              uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
              QFocusEvent::QFocusEvent((QFocusEvent *)&local_48,FocusIn,BacktabFocusReason - next);
              uStack_40._0_5_ = (uint5)(uint)uStack_40;
              (**(code **)(**(long **)(lVar4 + 0x88) + 0x130))
                        (*(long **)(lVar4 + 0x88),(QFocusEvent *)&local_48);
              cVar2 = uStack_40._4_1_;
              QFocusEvent::~QFocusEvent((QFocusEvent *)&local_48);
              if (cVar2 != '\0') goto LAB_00306772;
            }
          }
        }
        setFocus(this_00,BacktabFocusReason - next);
      }
LAB_00306772:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return this_00 != (QWidget *)0x0;
      }
      goto LAB_00306793;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar5 + 0xf0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    uVar3 = (*UNRECOVERED_JUMPTABLE)(plVar5,next);
    return (bool)uVar3;
  }
LAB_00306793:
  __stack_chk_fail();
}

Assistant:

bool QWidget::focusNextPrevChild(bool next)
{
    QWidget* p = parentWidget();
    bool isSubWindow = (windowType() == Qt::SubWindow);
    if (!isWindow() && !isSubWindow && p)
        return p->focusNextPrevChild(next);
#if QT_CONFIG(graphicsview)
    Q_D(QWidget);
    if (d->extra && d->extra->proxyWidget)
        return d->extra->proxyWidget->focusNextPrevChild(next);
#endif

    bool wrappingOccurred = false;
    QWidget *w = QApplicationPrivate::focusNextPrevChild_helper(this, next,
                                                                &wrappingOccurred);
    if (!w) return false;

    Qt::FocusReason reason = next ? Qt::TabFocusReason : Qt::BacktabFocusReason;

    /* If we are about to wrap the focus chain, give the platform
     * implementation a chance to alter the wrapping behavior.  This is
     * especially needed when the window is embedded in a window created by
     * another process.
     */
    if (wrappingOccurred) {
        QWindow *window = windowHandle();
        if (window != nullptr) {
            QWindowPrivate *winp = qt_window_private(window);

            if (winp->platformWindow != nullptr) {
                QFocusEvent event(QEvent::FocusIn, reason);
                event.ignore();
                winp->platformWindow->windowEvent(&event);
                if (event.isAccepted()) return true;
            }
        }
    }

    w->setFocus(reason);
    return true;
}